

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O1

int h264_cabac_renorm(bitstream *str,h264_cabac_context *cabac)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  uint32_t tmp;
  undefined8 uStack_28;
  
  uVar1 = cabac->codIRange;
  if (uVar1 < 0x100) {
    uStack_28 = in_RAX;
    do {
      cabac->codIRange = uVar1 * 2;
      uVar1 = cabac->codIOffset * 2;
      cabac->codIOffset = uVar1;
      if (str->dir == VS_ENCODE) {
        if (uVar1 < 0x200) {
          iVar2 = put_bit(str,cabac,0);
          if (iVar2 != 0) {
            return 1;
          }
        }
        else if (uVar1 < 0x400) {
          cabac->bitsOutstanding = cabac->bitsOutstanding + 1;
          cabac->codIOffset = uVar1 - 0x200;
        }
        else {
          iVar2 = put_bit(str,cabac,1);
          if (iVar2 != 0) {
            return 1;
          }
          cabac->codIOffset = cabac->codIOffset - 0x400;
        }
      }
      else {
        iVar2 = vs_u(str,(uint32_t *)((long)&uStack_28 + 4),1);
        if (iVar2 != 0) {
          return 1;
        }
        cabac->codIOffset = cabac->codIOffset | uStack_28._4_4_;
      }
      uVar1 = cabac->codIRange;
    } while (uVar1 < 0x100);
  }
  return 0;
}

Assistant:

int h264_cabac_renorm(struct bitstream *str, struct h264_cabac_context *cabac) {
	while (cabac->codIRange < 256) {
		cabac->codIRange <<= 1;
		cabac->codIOffset <<= 1;
		if (str->dir == VS_ENCODE) {
			if (cabac->codIOffset < 512) {
				if (put_bit(str, cabac, 0))
					return 1;
			} else if (cabac->codIOffset >= 1024) {
				if (put_bit(str, cabac, 1))
					return 1;
				cabac->codIOffset -= 1024;
			} else {
				cabac->bitsOutstanding++;
				cabac->codIOffset -= 512;
			}
		} else {
			uint32_t tmp;
			if (vs_u(str, &tmp, 1))
				return 1;
			cabac->codIOffset |= tmp;
		}
	}
	return 0;
}